

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O3

void dg::llvmdg::LLVMSlicer::adjustBBlocksSucessors(LLVMDependenceGraph *graph,uint32_t slice_id)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  BBlock<dg::LLVMNode> *this;
  BBlock<dg::LLVMNode> *pBVar3;
  ulong uVar4;
  LLVMDependenceGraph *pLVar5;
  _Link_type p_Var6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  size_t sVar11;
  LLVMBBlock *pLVar12;
  _List_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  _Link_type p_Var15;
  _Link_type p_Var16;
  _Link_type p_Var17;
  byte bVar18;
  uint uVar19;
  LLVMBBlock *pLVar20;
  DGContainer<unsigned_char,_8U> labels;
  BBlockEdge local_98;
  LLVMBBlock *local_88;
  LLVMDependenceGraph *local_80;
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  local_78;
  LLVMDependenceGraph *local_48;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var14 = *(_Rb_tree_node_base **)(graph + 0x78);
  local_38 = (_Rb_tree_node_base *)(graph + 0x68);
  if (p_Var14 != local_38) {
    local_88 = *(LLVMBBlock **)(graph + 0x98);
    local_48 = graph + 0x60;
    pLVar12 = (LLVMBBlock *)0x0;
    local_80 = graph;
    do {
      llvm::BasicBlock::getTerminator();
      this = (BBlock<dg::LLVMNode> *)p_Var14[1]._M_parent;
      sVar11 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar11 != 0) {
        if (sVar11 == 2) {
          if ((*(uint32_t *)
                &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                 _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[0x1c]._M_prev != slice_id)
             && (bVar7 = BBlock<dg::LLVMNode>::successorsAreSame(this), !bVar7)) {
            p_Var10 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ;
            p_Var1 = &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)p_Var10 == p_Var1) {
LAB_0011e8ba:
              if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
                 (uVar19 = BBlock<dg::LLVMNode>::removeSuccessorsTarget(this,this), uVar19 == 0)) {
                abort();
              }
            }
            else {
              do {
                if (*(BBlock<dg::LLVMNode> **)(p_Var10 + 1) == this) goto LAB_0011e8ba;
                p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
              } while ((_Rb_tree_header *)p_Var10 != p_Var1);
            }
          }
          sVar11 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        pLVar5 = local_80;
        if ((sVar11 == 1) &&
           (*(uint32_t *)
             &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
              _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[0x1c]._M_prev != slice_id)) {
          pLVar20 = *(LLVMBBlock **)
                     ((this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     + 1);
          if ((pLVar20 == local_88) && (pLVar20 = pLVar12, pLVar12 == (LLVMBBlock *)0x0)) {
            pLVar12 = createNewExitBB(local_80);
            *(LLVMBBlock **)(pLVar5 + 0x98) = pLVar12;
            if ((pLVar12->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&pLVar12->nodes)
            {
              p_Var13 = (_List_node_base *)0x0;
            }
            else {
              p_Var13 = (pLVar12->nodes).
                        super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                        _M_node.super__List_node_base._M_prev[1]._M_next;
            }
            *(_List_node_base **)(pLVar5 + 0x20) = p_Var13;
            pLVar20 = pLVar12;
          }
          BBlock<dg::LLVMNode>::removeSuccessors(this);
          local_78._M_impl.super__Rb_tree_header._M_header._M_color =
               local_78._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          local_78._M_impl._0_8_ = pLVar20;
          std::
          _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
          ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>
                    ((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                      *)&this->nextBBs,(BBlockEdge *)&local_78);
          local_78._M_impl._0_8_ = this;
          std::
          _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
          ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                    ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                      *)&pLVar20->prevBBs,(BBlock<dg::LLVMNode> **)&local_78);
        }
        else {
          local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_78._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_78._M_impl.super__Rb_tree_header._M_header;
          local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_78._M_impl.super__Rb_tree_header._M_header._M_right =
               local_78._M_impl.super__Rb_tree_header._M_header._M_left;
          local_40 = p_Var14;
          for (p_Var10 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var10 !=
              &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            if ((*(char *)&p_Var10[1]._M_parent != -1) &&
               (*(LLVMBBlock **)(p_Var10 + 1) != local_88)) {
              uVar4 = (ulong)local_98.target >> 8;
              local_98.target =
                   (BBlock<dg::LLVMNode> *)CONCAT71((int7)uVar4,*(char *)&p_Var10[1]._M_parent);
              std::
              _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
              ::_M_insert_unique<unsigned_char_const&>
                        ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                          *)&local_78,(uchar *)&local_98);
            }
          }
          iVar8 = llvm::Instruction::getNumSuccessors();
          if (iVar8 != 0) {
            uVar19 = 0;
            do {
              pLVar5 = local_80;
              bVar18 = (byte)uVar19;
              if ((_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent ==
                  (_Link_type)0x0) {
LAB_0011e9bf:
                if (pLVar12 == (LLVMBBlock *)0x0) {
                  pLVar12 = createNewExitBB(local_80);
                  *(LLVMBBlock **)(pLVar5 + 0x98) = pLVar12;
                  if ((pLVar12->nodes).
                      super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                      _M_node.super__List_node_base._M_next == (_List_node_base *)&pLVar12->nodes) {
                    p_Var13 = (_List_node_base *)0x0;
                  }
                  else {
                    p_Var13 = (pLVar12->nodes).
                              super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                              _M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
                  }
                  *(_List_node_base **)(pLVar5 + 0x20) = p_Var13;
                }
                local_98.target = pLVar12;
                local_98.label = bVar18;
                std::
                _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>
                          ((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                            *)&this->nextBBs,&local_98);
                local_98.target = this;
                std::
                _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                          ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                            *)&pLVar12->prevBBs,&local_98.target);
              }
              else {
                p_Var6 = (_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var17 = (_Link_type)&local_78._M_impl.super__Rb_tree_header;
                do {
                  p_Var16 = p_Var17;
                  p_Var15 = p_Var6;
                  bVar2 = (byte)*(size_t *)(p_Var15->_M_storage)._M_storage;
                  p_Var17 = p_Var15;
                  if (bVar2 < bVar18) {
                    p_Var17 = p_Var16;
                  }
                  p_Var6 = *(_Link_type *)
                            (&p_Var15->_M_storage + (ulong)(bVar2 < bVar18) * 8 + -0x10);
                } while (*(_Link_type *)(&p_Var15->_M_storage + (ulong)(bVar2 < bVar18) * 8 + -0x10)
                         != (_Link_type)0x0);
                if ((_Rb_tree_header *)p_Var17 == &local_78._M_impl.super__Rb_tree_header)
                goto LAB_0011e9bf;
                if (bVar2 < bVar18) {
                  p_Var15 = p_Var16;
                }
                if (bVar18 < (byte)*(size_t *)(p_Var15->_M_storage)._M_storage) goto LAB_0011e9bf;
              }
              uVar19 = uVar19 + 1;
              uVar9 = llvm::Instruction::getNumSuccessors();
            } while (uVar19 < uVar9);
          }
          if (pLVar12 != (LLVMBBlock *)0x0) {
            BBlock<dg::LLVMNode>::removeSuccessorsTarget(this,local_88);
          }
          if ((1 < (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
             (bVar7 = BBlock<dg::LLVMNode>::successorsAreSame(this), bVar7)) {
            pBVar3 = *(BBlock<dg::LLVMNode> **)
                      ((this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left + 1);
            BBlock<dg::LLVMNode>::removeSuccessors(this);
            local_98.label = 0;
            local_98.target = pBVar3;
            std::
            _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
            ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>
                      ((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                        *)&this->nextBBs,&local_98);
            local_98.target = this;
            std::
            _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
            ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                      ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                        *)&pBVar3->prevBBs,&local_98.target);
          }
          std::
          _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
          ::_M_erase(&local_78,
                     (_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent);
          p_Var14 = local_40;
        }
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != local_38);
    if (pLVar12 != (LLVMBBlock *)0x0) {
      local_78._M_impl._0_8_ = pLVar12->key;
      local_98.target = pLVar12;
      std::
      _Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>,std::_Select1st<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>>
      ::_M_emplace_unique<llvm::Value*&,dg::BBlock<dg::LLVMNode>*&>
                ((_Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>,std::_Select1st<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>>
                  *)local_48,(Value **)&local_78,&local_98.target);
    }
  }
  return;
}

Assistant:

static void adjustBBlocksSucessors(LLVMDependenceGraph *graph,
                                       uint32_t slice_id) {
        LLVMBBlock *oldExitBB = graph->getExitBB();
        assert(oldExitBB && "Don't have exit BB");

        LLVMBBlock *newExitBB = nullptr;

        for (auto &it : graph->getBlocks()) {
            const llvm::BasicBlock *llvmBB =
                    llvm::cast<llvm::BasicBlock>(it.first);
            const auto *const tinst = llvmBB->getTerminator();
            LLVMBBlock *BB = it.second;

            // nothing to do
            if (BB->successorsNum() == 0)
                continue;

            // if the BB has two successors and one is self-loop and
            // the branch inst is going to be removed, then the brach
            // that created the self-loop has no meaning to the sliced
            // program and this is going to be an unconditional jump
            // to the other branch
            // NOTE: do this before the next action, to rename the label if
            // needed
            if (BB->successorsNum() == 2 &&
                BB->getLastNode()->getSlice() != slice_id &&
                !BB->successorsAreSame() && BB->hasSuccessor(BB)) {
                bool found = BB->removeSuccessorsTarget(BB);
                // we have two different successors, none of them
                // is self-loop and we're slicing away the brach inst?
                // This should not happen...
                if (!found) {
                    assert(found && "Self loop did not have self loop...");
                    abort();
                }
                assert(BB->successorsNum() == 1 &&
                       "Should have only one successor");

                // continue here to rename the only label if needed
            }

            // if the BB has only one successor and the terminator
            // instruction is going to be sliced away, it means that
            // this is going to be an unconditional jump,
            // so just make the label 0
            if (BB->successorsNum() == 1 &&
                BB->getLastNode()->getSlice() != slice_id) {
                auto edge = *(BB->successors().begin());

                // modify the edge
                edge.label = 0;
                if (edge.target == oldExitBB) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

                    edge.target = newExitBB;
                }

                // replace the only edge
                BB->removeSuccessors();
                BB->addSuccessor(edge);

                continue;
            }

            // when we have more successors, we need to fill in
            // jumps under labels that we sliced away

            DGContainer<uint8_t> labels;
            // go through BBs successors and gather all labels
            // from edges that go from this BB. Also if there's
            // a jump to return block, replace it with new
            // return block
            for (const auto &succ : BB->successors()) {
                // skip artificial return basic block.
                if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL ||
                    succ.target == oldExitBB)
                    continue;

                labels.insert(succ.label);
            }

            // replace missing labels. Label should be from 0 to some max,
            // no gaps, so jump to safe exit under missing labels
            for (unsigned i = 0; i < tinst->getNumSuccessors(); ++i) {
                if (!labels.contains(i)) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

#ifndef NDEBUG
                    bool ret =
#endif
                            BB->addSuccessor(newExitBB, i);
                    assert(ret && "Already had this CFG edge, that is wrong");
                }
            }

            // this BB is going to be removed
            if (newExitBB)
                BB->removeSuccessorsTarget(oldExitBB);

            // if we have all successor edges pointing to the same
            // block, replace them with one successor (thus making
            // unconditional jump)
            if (BB->successorsNum() > 1 && BB->successorsAreSame()) {
                LLVMBBlock *succ = BB->successors().begin()->target;

                BB->removeSuccessors();
                BB->addSuccessor(succ, 0);
#ifdef NDEBUG
                assert(BB->successorsNum() == 1 &&
                       "BUG: in removeSuccessors() or addSuccessor()");
#endif
            }

#ifndef NDEBUG
            // check the BB
            labels.clear();
            for (const auto &succ : BB->successors()) {
                assert((!newExitBB || succ.target != oldExitBB) &&
                       "A block has the old BB as successor");
                // we can have more labels with different targets,
                // but we can not have one target with more labels
                assert(labels.insert(succ.label) && "Already have a label");
            }

            // check that we have all labels without any gep
            auto l = labels.begin();
            for (unsigned i = 0; i < labels.size(); ++i) {
                // set is ordered, so this must hold
                assert((*l == LLVMBBlock::MAX_BBLOCK_LABEL || i == *l++) &&
                       "Labels have a gap");
            }
#endif
        }

        if (newExitBB) {
            graph->addBlock(newExitBB->getKey(), newExitBB);
            assert(graph->getExitBB() == newExitBB);
            // NOTE: do not delete the old block
            // because it is the unified BB that is kept in
            // unique_ptr, so it will be deleted later automatically.
            // Deleting it would lead to double-free
        }
    }